

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  undefined3 in_register_00000011;
  uint uVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  
  fVar5 = (*r_min).x;
  fVar8 = (*r_min).y;
  IVar7 = *r_max;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar3 = GImGui->CurrentWindow;
    fVar1 = (pIVar3->ClipRect).Min.x;
    fVar2 = (pIVar3->ClipRect).Min.y;
    uVar4 = -(uint)(fVar1 <= fVar5);
    fVar5 = (float)(~uVar4 & (uint)fVar1 | uVar4 & (uint)fVar5);
    uVar4 = -(uint)(fVar2 <= fVar8);
    fVar8 = (float)(~uVar4 & (uint)fVar2 | (uint)fVar8 & uVar4);
    fVar1 = (pIVar3->ClipRect).Max.x;
    fVar2 = (pIVar3->ClipRect).Max.y;
    fVar6 = IVar7.y;
    if (fVar2 <= IVar7.y) {
      fVar6 = fVar2;
    }
    if (fVar1 <= IVar7.x) {
      IVar7.y = 0.0;
      IVar7.x = fVar1;
    }
    IVar7.y = fVar6;
  }
  fVar1 = (GImGui->Style).TouchExtraPadding.x;
  fVar2 = (GImGui->IO).MousePos.x;
  if (fVar2 < fVar5 - fVar1) {
    return false;
  }
  fVar5 = (GImGui->Style).TouchExtraPadding.y;
  fVar6 = (GImGui->IO).MousePos.y;
  return (bool)(fVar6 < IVar7.y + fVar5 & -(fVar8 - fVar5 <= fVar6) & -(fVar2 < fVar1 + IVar7.x));
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}